

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DumbDirectoryDatabase::read_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  uint uVar2;
  LogLevel LVar3;
  int iVar4;
  char *__filename;
  FILE *pFVar5;
  undefined8 uVar6;
  ulong __n;
  size_t sVar7;
  size_t file_size;
  FILE *file;
  string local_98;
  undefined1 local_78 [8];
  string path;
  char filename [25];
  PayloadReadFlags flags_local;
  void *blob_local;
  size_t *blob_size_local;
  Hash hash_local;
  ResourceTag tag_local;
  DumbDirectoryDatabase *this_local;
  
  if ((flags & 1) == 0) {
    if (this->mode == ReadOnly) {
      uVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this,(ulong)tag,hash);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else if (blob_size == (size_t *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        sprintf(path.field_2._M_local_buf + 8,"%02x.%016lx.json",(ulong)tag,hash);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_98,path.field_2._M_local_buf + 8,(allocator *)((long)&file + 7))
        ;
        Path::join((string *)local_78,&this->base_directory,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
        __filename = (char *)std::__cxx11::string::c_str();
        pFVar5 = fopen(__filename,"rb");
        if (pFVar5 == (FILE *)0x0) {
          LVar3 = get_thread_log_level();
          if ((int)LVar3 < 3) {
            uVar6 = std::__cxx11::string::c_str();
            bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to open file: %s\n",uVar6);
            pFVar5 = _stderr;
            if (!bVar1) {
              uVar6 = std::__cxx11::string::c_str();
              fprintf(pFVar5,"Fossilize ERROR: Failed to open file: %s\n",uVar6);
            }
          }
          this_local._7_1_ = false;
        }
        else {
          iVar4 = fseek(pFVar5,0,2);
          if (iVar4 < 0) {
            fclose(pFVar5);
            LVar3 = get_thread_log_level();
            if ((int)LVar3 < 3) {
              uVar6 = std::__cxx11::string::c_str();
              bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to seek in file: %s\n",uVar6);
              pFVar5 = _stderr;
              if (!bVar1) {
                uVar6 = std::__cxx11::string::c_str();
                fprintf(pFVar5,"Fossilize ERROR: Failed to seek in file: %s\n",uVar6);
              }
            }
            this_local._7_1_ = false;
          }
          else {
            __n = ftell(pFVar5);
            rewind(pFVar5);
            if ((blob == (void *)0x0) || (__n <= *blob_size)) {
              *blob_size = __n;
              if ((blob == (void *)0x0) || (sVar7 = fread(blob,1,__n,pFVar5), sVar7 == __n)) {
                fclose(pFVar5);
                this_local._7_1_ = true;
              }
              else {
                fclose(pFVar5);
                this_local._7_1_ = false;
              }
            }
            else {
              fclose(pFVar5);
              this_local._7_1_ = false;
            }
          }
        }
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode != DatabaseMode::ReadOnly)
			return false;

		if (!has_entry(tag, hash))
			return false;

		if (!blob_size)
			return false;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "rb");
		if (!file)
		{
			LOGE_LEVEL("Failed to open file: %s\n", path.c_str());
			return false;
		}

		if (fseek(file, 0, SEEK_END) < 0)
		{
			fclose(file);
			LOGE_LEVEL("Failed to seek in file: %s\n", path.c_str());
			return false;
		}

		size_t file_size = size_t(ftell(file));
		rewind(file);

		if (blob && *blob_size < file_size)
		{
			fclose(file);
			return false;
		}
		*blob_size = file_size;

		if (blob)
		{
			if (fread(blob, 1, file_size, file) != file_size)
			{
				fclose(file);
				return false;
			}
		}

		fclose(file);
		return true;
	}